

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::~tree_clusterizer
          (tree_clusterizer<crnlib::vec<16U,_float>_> *this)

{
  vec<16U,_float> *pvVar1;
  vq_node *p;
  raw_node *p_00;
  bool *p_01;
  VectorInfo *pVVar2;
  double *p_02;
  
  pvVar1 = (this->m_codebook).m_p;
  if (pvVar1 != (vec<16U,_float> *)0x0) {
    crnlib_free(pvVar1);
  }
  p = (this->m_nodes).m_p;
  if (p != (vq_node *)0x0) {
    crnlib_free(p);
  }
  p_00 = (this->m_node_index_map).m_values.m_p;
  if ((this->m_node_index_map).m_values.m_size == 0) {
    if (p_00 != (raw_node *)0x0) {
      crnlib_free(p_00);
    }
  }
  else {
    if (p_00 != (raw_node *)0x0) {
      crnlib_free(p_00);
      (this->m_node_index_map).m_values.m_p = (raw_node *)0x0;
      (this->m_node_index_map).m_values.m_size = 0;
      (this->m_node_index_map).m_values.m_capacity = 0;
    }
    (this->m_node_index_map).m_hash_shift = 0x20;
    (this->m_node_index_map).m_num_valid = 0;
    (this->m_node_index_map).m_grow_threshold = 0;
  }
  p_01 = (this->m_vectorComparison).m_p;
  if (p_01 != (bool *)0x0) {
    crnlib_free(p_01);
  }
  pVVar2 = (this->m_vectorsInfoRight).m_p;
  if (pVVar2 != (VectorInfo *)0x0) {
    crnlib_free(pVVar2);
  }
  pVVar2 = (this->m_vectorsInfoLeft).m_p;
  if (pVVar2 != (VectorInfo *)0x0) {
    crnlib_free(pVVar2);
  }
  pVVar2 = (this->m_vectorsInfo).m_p;
  if (pVVar2 != (VectorInfo *)0x0) {
    crnlib_free(pVVar2);
  }
  p_02 = (this->m_weightedDotProducts).m_p;
  if (p_02 != (double *)0x0) {
    crnlib_free(p_02);
  }
  pvVar1 = (this->m_weightedVectors).m_p;
  if (pvVar1 != (vec<16U,_float> *)0x0) {
    crnlib_free(pvVar1);
  }
  return;
}

Assistant:

tree_clusterizer() {}